

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncInitializer.hpp
# Opt level: O3

ASYNC_TASK_STATUS __thiscall
Diligent::AsyncInitializer::Update(AsyncInitializer *this,bool WaitForCompletion)

{
  SpinLock *this_00;
  __int_type_conflict _Var1;
  byte bVar2;
  ASYNC_TASK_STATUS AVar3;
  ASYNC_TASK_STATUS AVar4;
  ASYNC_TASK_STATUS AVar5;
  ASYNC_TASK_STATUS AVar6;
  char (*in_RCX) [40];
  bool bVar7;
  string msg;
  string local_50;
  
  AVar6 = (this->m_Status)._M_i;
  if (AVar6 == ASYNC_TASK_STATUS_UNKNOWN) {
    FormatString<char[26],char[40]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrStatus != ASYNC_TASK_STATUS_UNKNOWN",in_RCX);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"Update",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/AsyncInitializer.hpp"
               ,0x35);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else if (ASYNC_TASK_STATUS_RUNNING < AVar6) goto LAB_00212927;
  this_00 = &this->m_TaskLock;
  LOCK();
  bVar2 = (this->m_TaskLock).m_IsLocked._M_base._M_i;
  (this->m_TaskLock).m_IsLocked._M_base._M_i = true;
  UNLOCK();
  while ((bVar2 & 1) != 0) {
    Threading::SpinLock::Wait(this_00);
    LOCK();
    bVar2 = (this_00->m_IsLocked)._M_base._M_i;
    (this_00->m_IsLocked)._M_base._M_i = true;
    UNLOCK();
  }
  RefCntWeakPtr<Diligent::IAsyncTask>::Lock((RefCntWeakPtr<Diligent::IAsyncTask> *)&local_50);
  Threading::SpinLock::unlock(this_00);
  if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
    if (WaitForCompletion) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 0x58))(local_50._M_dataplus._M_p);
    }
    AVar3 = (**(code **)(*(long *)local_50._M_dataplus._M_p + 0x38))(local_50._M_dataplus._M_p);
    if (AVar3 - ASYNC_TASK_STATUS_CANCELLED < 2) {
      while( true ) {
        LOCK();
        _Var1 = (this_00->m_IsLocked)._M_base._M_i;
        (this_00->m_IsLocked)._M_base._M_i = true;
        UNLOCK();
        if ((_Var1 & 1U) == 0) break;
        Threading::SpinLock::Wait(this_00);
      }
      RefCntWeakPtr<Diligent::IAsyncTask>::Release(&this->m_wpTask);
      Threading::SpinLock::unlock(this_00);
    }
    if (AVar6 < AVar3) {
      LOCK();
      AVar4 = (this->m_Status)._M_i;
      bVar7 = AVar6 == AVar4;
      if (bVar7) {
        (this->m_Status)._M_i = AVar3;
        AVar4 = AVar6;
      }
      UNLOCK();
      while (!bVar7) {
        AVar6 = AVar3;
        if (AVar3 < AVar4) {
          AVar6 = AVar4;
        }
        LOCK();
        AVar5 = (this->m_Status)._M_i;
        bVar7 = AVar4 == AVar5;
        if (bVar7) {
          (this->m_Status)._M_i = AVar6;
          AVar5 = AVar4;
        }
        UNLOCK();
        AVar4 = AVar5;
      }
    }
    (**(code **)(*(long *)local_50._M_dataplus._M_p + 0x10))(local_50._M_dataplus._M_p);
  }
LAB_00212927:
  return (this->m_Status)._M_i;
}

Assistant:

ASYNC_TASK_STATUS Update(bool WaitForCompletion)
    {
        ASYNC_TASK_STATUS CurrStatus = m_Status.load();
        VERIFY_EXPR(CurrStatus != ASYNC_TASK_STATUS_UNKNOWN);
        if (CurrStatus <= ASYNC_TASK_STATUS_RUNNING)
        {
            RefCntAutoPtr<IAsyncTask> pTask;
            {
                Threading::SpinLockGuard Guard{m_TaskLock};
                pTask = m_wpTask.Lock();
            }

            ASYNC_TASK_STATUS NewStatus = ASYNC_TASK_STATUS_UNKNOWN;
            if (pTask)
            {
                if (WaitForCompletion)
                {
                    pTask->WaitForCompletion();
                }
                NewStatus = pTask->GetStatus();
            }

            if (NewStatus == ASYNC_TASK_STATUS_CANCELLED || NewStatus == ASYNC_TASK_STATUS_COMPLETE)
            {
                Threading::SpinLockGuard Guard{m_TaskLock};
                m_wpTask.Release();
            }

            if (NewStatus > CurrStatus)
            {
                while (!m_Status.compare_exchange_weak(CurrStatus, (std::max)(CurrStatus, NewStatus)))
                {
                    // If exchange fails, CurrStatus will hold the actual value of m_Status.
                }
            }
        }

        return m_Status.load();
    }